

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O0

int __thiscall
Yolact::draw(Yolact *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects)

{
  code *pcVar1;
  uchar uVar2;
  Scalar_<double> *pSVar3;
  long lVar4;
  uchar *puVar5;
  vector<Object,_std::allocator<Object>_> *in_RDX;
  Mat *in_RSI;
  int x_1;
  uchar *p;
  uchar *mp;
  int y_1;
  int y;
  int x;
  Size label_size;
  int baseLine;
  char text [256];
  uchar *color;
  Object *obj;
  size_t i;
  int color_index;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  allocator *in_stack_fffffffffffffd28;
  _InputOutputArray *in_stack_fffffffffffffd30;
  Rect_<float> *in_stack_fffffffffffffd38;
  Scalar_<double> *this_00;
  int local_2b4;
  uchar *local_2b0;
  int local_29c;
  undefined1 local_298 [36];
  Point_<int> local_274;
  allocator local_269;
  string local_268 [32];
  undefined1 local_248 [24];
  undefined1 local_230 [32];
  Size_<int> local_210;
  Point_<int> local_208;
  Rect_<int> local_200;
  undefined1 local_1f0 [28];
  int local_1d4;
  int local_1d0;
  undefined1 local_1c9 [37];
  int local_1a4;
  int local_1a0;
  int local_19c;
  _InputOutputArray local_198 [11];
  undefined1 local_90 [48];
  undefined1 local_60 [16];
  undefined1 local_50 [24];
  uchar (*local_38) [3];
  const_reference local_30;
  Scalar_<double> *local_28;
  int local_1c;
  vector<Object,_std::allocator<Object>_> *local_18;
  Mat *local_10;
  
  local_1c = 0;
  local_28 = (Scalar_<double> *)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (this_00 = local_28,
        pSVar3 = (Scalar_<double> *)std::vector<Object,_std::allocator<Object>_>::size(local_18),
        this_00 < pSVar3) {
    local_30 = std::vector<Object,_std::allocator<Object>_>::operator[]
                         (local_18,(size_type)local_28);
    if (0.15 <= local_30->prob) {
      fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",(double)local_30->prob,
              (double)(local_30->rect).x,(double)(local_30->rect).y,(double)(local_30->rect).width,
              (double)(local_30->rect).height,(ulong)(uint)local_30->label);
      lVar4 = (long)local_1c;
      local_1c = local_1c + 1;
      local_38 = draw::colors + lVar4;
      cv::_InputOutputArray::_InputOutputArray
                (in_stack_fffffffffffffd30,(Mat *)in_stack_fffffffffffffd28);
      cv::Rect_::operator_cast_to_Rect_(in_stack_fffffffffffffd38);
      cv::Scalar_<double>::Scalar_
                (this_00,(double)in_stack_fffffffffffffd38,(double)in_stack_fffffffffffffd30,
                 (double)in_stack_fffffffffffffd28,
                 (double)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      cv::rectangle(local_50,local_60,local_90,1,8,0);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x153491);
      in_stack_fffffffffffffd30 = local_198;
      sprintf((char *)in_stack_fffffffffffffd30,"%s %.1f%%",(double)(local_30->prob * 100.0),
              draw::class_names[local_30->label]);
      local_19c = 0;
      in_stack_fffffffffffffd38 = (Rect_<float> *)local_1c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1c9 + 1),(char *)in_stack_fffffffffffffd30,
                 (allocator *)in_stack_fffffffffffffd38);
      cv::getTextSize((string *)&local_1a4,(int)local_1c9 + 1,0.5,0,(int *)0x1);
      std::__cxx11::string::~string((string *)(local_1c9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1c9);
      local_1d0 = (int)(local_30->rect).x;
      local_1d4 = (int)(((local_30->rect).y - (float)local_1a0) - (float)local_19c);
      if (local_1d4 < 0) {
        local_1d4 = 0;
      }
      if (*(int *)(local_10 + 0xc) < local_1d0 + local_1a4) {
        local_1d0 = *(int *)(local_10 + 0xc) - local_1a4;
      }
      cv::_InputOutputArray::_InputOutputArray
                (in_stack_fffffffffffffd30,(Mat *)in_stack_fffffffffffffd28);
      cv::Point_<int>::Point_(&local_208,local_1d0,local_1d4);
      cv::Size_<int>::Size_(&local_210,local_1a4,local_1a0 + local_19c);
      cv::Rect_<int>::Rect_(&local_200,&local_208,&local_210);
      cv::Scalar_<double>::Scalar_
                (this_00,(double)in_stack_fffffffffffffd38,(double)in_stack_fffffffffffffd30,
                 (double)in_stack_fffffffffffffd28,
                 (double)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      cv::rectangle(local_1f0,&local_200,local_230,0xffffffff,8,0);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x153726);
      cv::_InputOutputArray::_InputOutputArray
                (in_stack_fffffffffffffd30,(Mat *)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd28 = &local_269;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,(char *)local_198,in_stack_fffffffffffffd28);
      cv::Point_<int>::Point_(&local_274,local_1d0,local_1d4 + local_1a0);
      cv::Scalar_<double>::Scalar_
                (this_00,(double)in_stack_fffffffffffffd38,(double)in_stack_fffffffffffffd30,
                 (double)in_stack_fffffffffffffd28,
                 (double)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      in_stack_fffffffffffffd20 = 0;
      cv::putText(0x3fe0000000000000,local_248,local_268,&local_274,0,local_298,1,8);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x153806);
      for (local_29c = 0; local_29c < *(int *)(local_10 + 8); local_29c = local_29c + 1) {
        puVar5 = cv::Mat::ptr(&local_30->mask,local_29c);
        local_2b0 = cv::Mat::ptr(local_10,local_29c);
        for (local_2b4 = 0; local_2b4 < *(int *)(local_10 + 0xc); local_2b4 = local_2b4 + 1) {
          if (puVar5[local_2b4] == 0xff) {
            uVar2 = cv::saturate_cast<unsigned_char>
                              ((double)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                              );
            *local_2b0 = uVar2;
            uVar2 = cv::saturate_cast<unsigned_char>
                              ((double)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                              );
            local_2b0[1] = uVar2;
            uVar2 = cv::saturate_cast<unsigned_char>
                              ((double)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                              );
            local_2b0[2] = uVar2;
          }
          local_2b0 = local_2b0 + 3;
        }
      }
    }
    local_28 = (Scalar_<double> *)
               ((long)(local_28->super_Vec<double,_4>).super_Matx<double,_4,_1>.val + 1);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int Yolact::draw(cv::Mat& image, const std::vector<Object>& objects) 
{
    static const char* class_names[] = {"background",
                                        "person", "bicycle", "car", "motorcycle", "airplane", "bus",
                                        "train", "truck", "boat", "traffic light", "fire hydrant",
                                        "stop sign", "parking meter", "bench", "bird", "cat", "dog",
                                        "horse", "sheep", "cow", "elephant", "bear", "zebra", "giraffe",
                                        "backpack", "umbrella", "handbag", "tie", "suitcase", "frisbee",
                                        "skis", "snowboard", "sports ball", "kite", "baseball bat",
                                        "baseball glove", "skateboard", "surfboard", "tennis racket",
                                        "bottle", "wine glass", "cup", "fork", "knife", "spoon", "bowl",
                                        "banana", "apple", "sandwich", "orange", "broccoli", "carrot",
                                        "hot dog", "pizza", "donut", "cake", "chair", "couch",
                                        "potted plant", "bed", "dining table", "toilet", "tv", "laptop",
                                        "mouse", "remote", "keyboard", "cell phone", "microwave", "oven",
                                        "toaster", "sink", "refrigerator", "book", "clock", "vase",
                                        "scissors", "teddy bear", "hair drier", "toothbrush"
                                       };

    static const unsigned char colors[19][3] = {
        {244, 67, 54},
        {233, 30, 99},
        {156, 39, 176},
        {103, 58, 183},
        {63, 81, 181},
        {33, 150, 243},
        {3, 169, 244},
        {0, 188, 212},
        {0, 150, 136},
        {76, 175, 80},
        {139, 195, 74},
        {205, 220, 57},
        {255, 235, 59},
        {255, 193, 7},
        {255, 152, 0},
        {255, 87, 34},
        {121, 85, 72},
        {158, 158, 158},
        {96, 125, 139}
    };

    //cv::Mat image = bgr.clone();

    int color_index = 0;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];

        if (obj.prob < 0.15)
            continue;

        fprintf(stderr, "%d = %.5f at %.2f %.2f %.2f x %.2f\n", obj.label, obj.prob,
                obj.rect.x, obj.rect.y, obj.rect.width, obj.rect.height);

        const unsigned char* color = colors[color_index++];

        cv::rectangle(image, obj.rect, cv::Scalar(color[0], color[1], color[2]));

        char text[256];
        sprintf(text, "%s %.1f%%", class_names[obj.label], obj.prob * 100);

        int baseLine = 0;
        cv::Size label_size = cv::getTextSize(text, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);

        int x = obj.rect.x;
        int y = obj.rect.y - label_size.height - baseLine;
        if (y < 0)
            y = 0;
        if (x + label_size.width > image.cols)
            x = image.cols - label_size.width;

        cv::rectangle(image, cv::Rect(cv::Point(x, y), cv::Size(label_size.width, label_size.height + baseLine)),
                      cv::Scalar(255, 255, 255), -1);

        cv::putText(image, text, cv::Point(x, y + label_size.height),
                    cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0, 0, 0));

        // draw mask
        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            uchar* p = image.ptr(y);
            for (int x = 0; x < image.cols; x++)
            {
                if (mp[x] == 255)
                {
                    p[0] = cv::saturate_cast<uchar>(p[0] * 0.5 + color[0] * 0.5);
                    p[1] = cv::saturate_cast<uchar>(p[1] * 0.5 + color[1] * 0.5);
                    p[2] = cv::saturate_cast<uchar>(p[2] * 0.5 + color[2] * 0.5);
                }
                p += 3;
            }
        }
    }

    // cv::imwrite("result.png", image);
    // cv::imshow("image", image);
    // cv::waitKey(0);
}